

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

CURLcode operate(GlobalConfig *config,int argc,char **argv)

{
  int iVar1;
  ParameterError PVar2;
  bool bVar3;
  OperationConfig *local_38;
  OperationConfig *operation;
  size_t count;
  ParameterError res;
  CURLcode result;
  char **argv_local;
  int argc_local;
  GlobalConfig *config_local;
  
  count._4_4_ = CURLE_OK;
  setlocale(6,"");
  if ((((argc == 1) ||
       ((iVar1 = curl_strequal(argv[1],"-q"), iVar1 == 0 &&
        (iVar1 = curl_strequal(argv[1],"--disable"), iVar1 == 0)))) &&
      (parseconfig((char *)0x0,config), argc < 2)) && (config->first->url_list == (getout *)0x0)) {
    helpf(config->errors,(char *)0x0);
    count._4_4_ = CURLE_FAILED_INIT;
  }
  if (count._4_4_ == CURLE_OK) {
    PVar2 = parse_args(config,argc,argv);
    if (PVar2 == PARAM_OK) {
      if (config->libcurl != (char *)0x0) {
        count._4_4_ = easysrc_init();
      }
      if (count._4_4_ == CURLE_OK) {
        operation = (OperationConfig *)0x0;
        for (local_38 = config->first; count._4_4_ == CURLE_OK && local_38 != (OperationConfig *)0x0
            ; local_38 = local_38->next) {
          count._4_4_ = get_args(local_38,(size_t)operation);
          operation = (OperationConfig *)((long)&operation->easy + 1);
        }
        config->current = config->first;
        while( true ) {
          bVar3 = false;
          if (count._4_4_ == CURLE_OK) {
            bVar3 = config->current != (OperationConfig *)0x0;
          }
          if (!bVar3) break;
          count._4_4_ = operate_do(config,config->current);
          config->current = config->current->next;
          if ((config->current != (OperationConfig *)0x0) && (config->current->easy != (CURL *)0x0))
          {
            curl_easy_reset(config->current->easy);
          }
        }
        if (config->libcurl != (char *)0x0) {
          easysrc_cleanup();
          dumpeasysrc(config);
        }
      }
      else {
        helpf(config->errors,"out of memory\n");
      }
    }
    else {
      count._4_4_ = CURLE_OK;
      if (PVar2 == PARAM_HELP_REQUESTED) {
        tool_help();
      }
      else if (PVar2 == PARAM_MANUAL_REQUESTED) {
        hugehelp();
      }
      else if (PVar2 == PARAM_VERSION_INFO_REQUESTED) {
        tool_version_info();
      }
      else if (PVar2 == PARAM_ENGINES_REQUESTED) {
        tool_list_engines(config->easy);
      }
      else if (PVar2 == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL) {
        count._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
      }
      else {
        count._4_4_ = CURLE_FAILED_INIT;
      }
    }
  }
  return count._4_4_;
}

Assistant:

CURLcode operate(struct GlobalConfig *config, int argc, argv_item_t argv[])
{
  CURLcode result = CURLE_OK;

  /* Setup proper locale from environment */
#ifdef HAVE_SETLOCALE
  setlocale(LC_ALL, "");
#endif

  /* Parse .curlrc if necessary */
  if((argc == 1) ||
     (!curl_strequal(argv[1], "-q") &&
      !curl_strequal(argv[1], "--disable"))) {
    parseconfig(NULL, config); /* ignore possible failure */

    /* If we had no arguments then make sure a url was specified in .curlrc */
    if((argc < 2) && (!config->first->url_list)) {
      helpf(config->errors, NULL);
      result = CURLE_FAILED_INIT;
    }
  }

  if(!result) {
    /* Parse the command line arguments */
    ParameterError res = parse_args(config, argc, argv);
    if(res) {
      result = CURLE_OK;

      /* Check if we were asked for the help */
      if(res == PARAM_HELP_REQUESTED)
        tool_help();
      /* Check if we were asked for the manual */
      else if(res == PARAM_MANUAL_REQUESTED)
        hugehelp();
      /* Check if we were asked for the version information */
      else if(res == PARAM_VERSION_INFO_REQUESTED)
        tool_version_info();
      /* Check if we were asked to list the SSL engines */
      else if(res == PARAM_ENGINES_REQUESTED)
        tool_list_engines(config->easy);
      else if(res == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL)
        result = CURLE_UNSUPPORTED_PROTOCOL;
      else
        result = CURLE_FAILED_INIT;
    }
    else {
#ifndef CURL_DISABLE_LIBCURL_OPTION
      if(config->libcurl) {
        /* Initialise the libcurl source output */
        result = easysrc_init();
      }
#endif

      /* Perform the main operations */
      if(!result) {
        size_t count = 0;
        struct OperationConfig *operation = config->first;

        /* Get the required arguments for each operation */
        while(!result && operation) {
          result = get_args(operation, count++);

          operation = operation->next;
        }

        /* Set the current operation pointer */
        config->current = config->first;

        /* Perform each operation */
        while(!result && config->current) {
          result = operate_do(config, config->current);

          config->current = config->current->next;

          if(config->current && config->current->easy)
            curl_easy_reset(config->current->easy);
        }

#ifndef CURL_DISABLE_LIBCURL_OPTION
        if(config->libcurl) {
          /* Cleanup the libcurl source output */
          easysrc_cleanup();

          /* Dump the libcurl code if previously enabled */
          dumpeasysrc(config);
        }
#endif
      }
      else
        helpf(config->errors, "out of memory\n");
    }
  }

  return result;
}